

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_347e::ProfileDataTest_StartStopNoOptionsEmpty_Test::
ProfileDataTest_StartStopNoOptionsEmpty_Test(ProfileDataTest_StartStopNoOptionsEmpty_Test *this)

{
  ProfileDataTest_StartStopNoOptionsEmpty_Test *this_local;
  
  ProfileDataTest::ProfileDataTest(&this->super_ProfileDataTest);
  (this->super_ProfileDataTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ProfileDataTest_StartStopNoOptionsEmpty_Test_001977a8;
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartStopNoOptionsEmpty) {
  // We're not requesting a specific period, implementation can do
  // whatever it likes.
  ProfileDataSlot slots[] = {
    0, 3, 0, 0 /* skipped */, 0,        // binary header
    0, 1, 0                             // binary trailer
  };
  int slots_to_skip[] = { 3 };

  ExpectStopped();
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(),
                               ProfileData::Options()));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.CheckWithSkips(slots, arraysize(slots),
                                              slots_to_skip,
                                              arraysize(slots_to_skip)));
}